

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse4.cpp
# Opt level: O2

void convertARGBToRGBA64PM_sse4<false>(QRgba64 *buffer,uint *src,int count)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  QRgba64 QVar3;
  uint uVar4;
  long lVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar16 [16];
  undefined1 in_XMM6 [16];
  QRgba64 local_40;
  long local_38;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  auVar2 = _DAT_0060d830;
  auVar1 = _DAT_005f11c0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  for (lVar5 = 0; lVar5 < count + -3; lVar5 = lVar5 + 4) {
    auVar16 = *(undefined1 (*) [16])(src + lVar5);
    if ((auVar1 & auVar16) == (undefined1  [16])0x0) {
      buffer[lVar5].rgba = 0;
      (buffer + lVar5)[1].rgba = 0;
      buffer[lVar5 + 2].rgba = 0;
      (buffer + lVar5 + 2)[1].rgba = 0;
    }
    else {
      auVar6 = pshufb(auVar16,auVar2);
      auVar15._0_14_ = auVar6._0_14_;
      auVar15[0xe] = auVar6[7];
      auVar15[0xf] = auVar6[7];
      auVar14._14_2_ = auVar15._14_2_;
      auVar14._0_13_ = auVar6._0_13_;
      auVar14[0xd] = auVar6[6];
      auVar13._13_3_ = auVar14._13_3_;
      auVar13._0_12_ = auVar6._0_12_;
      auVar13[0xc] = auVar6[6];
      auVar12._12_4_ = auVar13._12_4_;
      auVar12._0_11_ = auVar6._0_11_;
      auVar12[0xb] = auVar6[5];
      auVar11._11_5_ = auVar12._11_5_;
      auVar11._0_10_ = auVar6._0_10_;
      auVar11[10] = auVar6[5];
      auVar10._10_6_ = auVar11._10_6_;
      auVar10._0_9_ = auVar6._0_9_;
      auVar10[9] = auVar6[4];
      auVar9._9_7_ = auVar10._9_7_;
      auVar9._0_8_ = auVar6._0_8_;
      auVar9[8] = auVar6[4];
      auVar8._8_8_ = auVar9._8_8_;
      auVar8[7] = auVar6[3];
      auVar8[6] = auVar6[3];
      auVar8[5] = auVar6[2];
      auVar8[4] = auVar6[2];
      auVar8[3] = auVar6[1];
      auVar8[2] = auVar6[1];
      auVar8[1] = auVar6[0];
      auVar8[0] = auVar6[0];
      auVar7[1] = auVar6[8];
      auVar7[0] = auVar6[8];
      auVar7[2] = auVar6[9];
      auVar7[3] = auVar6[9];
      auVar7[4] = auVar6[10];
      auVar7[5] = auVar6[10];
      auVar7[6] = auVar6[0xb];
      auVar7[7] = auVar6[0xb];
      auVar7[8] = auVar6[0xc];
      auVar7[9] = auVar6[0xc];
      auVar7[10] = auVar6[0xd];
      auVar7[0xb] = auVar6[0xd];
      auVar7[0xc] = auVar6[0xe];
      auVar7[0xd] = auVar6[0xe];
      auVar7[0xf] = auVar6[0xf];
      auVar7[0xe] = auVar7[0xf];
      if ((auVar1 & ~auVar16) == (undefined1  [16])0x0) {
        *(undefined1 (*) [16])(buffer + lVar5) = auVar8;
        *(undefined1 (*) [16])(buffer + lVar5 + 2) = auVar7;
      }
      else {
        auVar16 = pshuflw(in_XMM5,auVar8,0xff);
        auVar16 = pshufhw(auVar16,auVar16,0xff);
        auVar16 = pmulhuw(auVar16,auVar8);
        auVar6 = pshuflw(in_XMM6,auVar7,0xff);
        auVar6 = pshufhw(auVar6,auVar6,0xff);
        in_XMM6 = pmulhuw(auVar6,auVar7);
        auVar6._0_2_ = auVar16._0_2_ - (auVar16._0_2_ >> 0xf);
        auVar6._2_2_ = auVar16._2_2_ - (auVar16._2_2_ >> 0xf);
        auVar6._4_2_ = auVar16._4_2_ - (auVar16._4_2_ >> 0xf);
        auVar6._6_2_ = auVar16._6_2_ - (auVar16._6_2_ >> 0xf);
        auVar6._8_2_ = auVar16._8_2_ - (auVar16._8_2_ >> 0xf);
        auVar6._10_2_ = auVar16._10_2_ - (auVar16._10_2_ >> 0xf);
        auVar6._12_2_ = auVar16._12_2_ - (auVar16._12_2_ >> 0xf);
        auVar6._14_2_ = auVar16._14_2_ - (auVar16._14_2_ >> 0xf);
        auVar16._0_2_ = in_XMM6._0_2_ - (in_XMM6._0_2_ >> 0xf);
        auVar16._2_2_ = in_XMM6._2_2_ - (in_XMM6._2_2_ >> 0xf);
        auVar16._4_2_ = in_XMM6._4_2_ - (in_XMM6._4_2_ >> 0xf);
        auVar16._6_2_ = in_XMM6._6_2_ - (in_XMM6._6_2_ >> 0xf);
        auVar16._8_2_ = in_XMM6._8_2_ - (in_XMM6._8_2_ >> 0xf);
        auVar16._10_2_ = in_XMM6._10_2_ - (in_XMM6._10_2_ >> 0xf);
        auVar16._12_2_ = in_XMM6._12_2_ - (in_XMM6._12_2_ >> 0xf);
        auVar16._14_2_ = in_XMM6._14_2_ - (in_XMM6._14_2_ >> 0xf);
        auVar6 = pblendw(auVar6,auVar8,0x88);
        in_XMM5 = pblendw(auVar16,auVar7,0x88);
        *(undefined1 (*) [16])(buffer + lVar5) = auVar6;
        *(undefined1 (*) [16])(buffer + lVar5 + 2) = in_XMM5;
      }
    }
  }
  uVar4 = 0;
  for (; (uVar4 < 3 && (lVar5 < count)); lVar5 = lVar5 + 1) {
    local_40 = QRgba64::fromArgb32(src[lVar5]);
    QVar3 = QRgba64::premultiplied(&local_40);
    buffer[lVar5].rgba = QVar3.rgba;
    uVar4 = uVar4 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void convertARGBToRGBA64PM_sse4(QRgba64 *buffer, const uint *src, int count)
{
    int i = 0;
    const __m128i alphaMask = _mm_set1_epi32(0xff000000);
    const __m128i rgbaMask = _mm_setr_epi8(2, 1, 0, 3, 6, 5, 4, 7, 10, 9, 8, 11, 14, 13, 12, 15);
    const __m128i shuffleMask = _mm_setr_epi8(6, 7, 6, 7, 6, 7, 6, 7, 14, 15, 14, 15, 14, 15, 14, 15);
    const __m128i zero = _mm_setzero_si128();

    for (; i < count - 3; i += 4) {
        __m128i srcVector = _mm_loadu_si128((const __m128i *)&src[i]);
        if (!_mm_testz_si128(srcVector, alphaMask)) {
            bool cf = _mm_testc_si128(srcVector, alphaMask);

            if (!RGBA)
                srcVector = _mm_shuffle_epi8(srcVector, rgbaMask);
            const __m128i src1 = _mm_unpacklo_epi8(srcVector, srcVector);
            const __m128i src2 = _mm_unpackhi_epi8(srcVector, srcVector);
            if (!cf) {
                __m128i alpha1 = _mm_shuffle_epi8(src1, shuffleMask);
                __m128i alpha2 = _mm_shuffle_epi8(src2, shuffleMask);
                __m128i dst1 = _mm_mulhi_epu16(src1, alpha1);
                __m128i dst2 = _mm_mulhi_epu16(src2, alpha2);
                // Map 0->0xfffe to 0->0xffff
                dst1 = _mm_add_epi16(dst1, _mm_srli_epi16(dst1, 15));
                dst2 = _mm_add_epi16(dst2, _mm_srli_epi16(dst2, 15));
                // correct alpha value:
                dst1 = _mm_blend_epi16(dst1, src1, 0x88);
                dst2 = _mm_blend_epi16(dst2, src2, 0x88);
                _mm_storeu_si128((__m128i *)&buffer[i], dst1);
                _mm_storeu_si128((__m128i *)&buffer[i + 2], dst2);
            } else {
                _mm_storeu_si128((__m128i *)&buffer[i], src1);
                _mm_storeu_si128((__m128i *)&buffer[i + 2], src2);
            }
        } else {
            _mm_storeu_si128((__m128i *)&buffer[i], zero);
            _mm_storeu_si128((__m128i *)&buffer[i + 2], zero);
        }
    }

    SIMD_EPILOGUE(i, count, 3) {
        const uint s = RGBA ? RGBA2ARGB(src[i]) : src[i];
        buffer[i] = QRgba64::fromArgb32(s).premultiplied();
    }
}